

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O0

int __thiscall ncnn::Normalize::load_model(Normalize *this,ModelBin *mb)

{
  bool bVar1;
  undefined8 *in_RSI;
  Mat *in_RDI;
  Mat *this_00;
  Mat local_50;
  int local_4;
  
  this_00 = &local_50;
  (**(code **)*in_RSI)(this_00,in_RSI,in_RDI[2].dims,1);
  Mat::operator=(this_00,in_RDI);
  Mat::~Mat((Mat *)0x149c7c);
  bVar1 = Mat::empty(in_RDI);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Normalize::load_model(const ModelBin& mb)
{
    scale_data = mb.load(scale_data_size, 1);
    if (scale_data.empty())
        return -100;

    return 0;
}